

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::operator=
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,
          Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *param_1)

{
  Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *param_1_local;
  Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this_local;
  
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::operator=
            (&this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>,
             &param_1->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>);
  return this;
}

Assistant:

class GTEST_API_ Matcher<internal::StringView>
    : public internal::MatcherBase<internal::StringView> {
 public:
  Matcher() {}

  explicit Matcher(const MatcherInterface<const internal::StringView&>* impl)
      : internal::MatcherBase<internal::StringView>(impl) {}
  explicit Matcher(const MatcherInterface<internal::StringView>* impl)
      : internal::MatcherBase<internal::StringView>(impl) {}

  template <typename M, typename = typename std::remove_reference<
                            M>::type::is_gtest_matcher>
  Matcher(M&& m)  // NOLINT
      : internal::MatcherBase<internal::StringView>(std::forward<M>(m)) {}

  // Allows the user to write str instead of Eq(str) sometimes, where
  // str is a std::string object.
  Matcher(const std::string& s);  // NOLINT

  // Allows the user to write "foo" instead of Eq("foo") sometimes.
  Matcher(const char* s);  // NOLINT

  // Allows the user to pass absl::string_views or std::string_views directly.
  Matcher(internal::StringView s);  // NOLINT
}